

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool equilibrationScaleMatrix(HighsOptions *options,HighsLp *lp,HighsInt use_scale_strategy)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  double *pdVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  double dVar6;
  HighsLogOptions *log_options_;
  HighsLogOptions *log_options__00;
  char *format;
  HighsLogOptions *log_options__01;
  HighsLogOptions *log_options__02;
  HighsInt iRow_5;
  HighsInt k_4;
  HighsInt iCol_3;
  bool poor_improvement;
  double improvement_factor_required;
  double improvement_factor;
  bool possibly_abandon_scaling;
  double matrix_value_ratio_improvement;
  double original_matrix_value_ratio;
  double matrix_value_ratio;
  double extreme_equilibration_improvement;
  double row_ratio;
  double col_ratio;
  double original_row_ratio;
  double original_col_ratio;
  double mean_equilibration_improvement;
  double geomean_row;
  double geomean_col;
  double geomean_original_row;
  double geomean_original_col;
  double geomean_row_equilibration;
  double geomean_col_equilibration;
  double geomean_original_row_equilibration;
  double geomean_original_col_equilibration;
  double row_equilibration_1;
  double original_row_equilibration;
  HighsInt iRow_4;
  double col_equilibration_1;
  double original_col_equilibration;
  double value_3;
  double original_value;
  HighsInt iRow_3;
  HighsInt k_3;
  double col_max_value_1;
  double col_min_value_1;
  double original_col_max_value;
  double original_col_min_value;
  HighsInt iCol_2;
  vector<double,_std::allocator<double>_> original_row_max_value;
  vector<double,_std::allocator<double>_> original_row_min_value;
  double max_row_equilibration;
  double sum_log_row_equilibration;
  double min_row_equilibration;
  double max_col_equilibration;
  double sum_log_col_equilibration;
  double min_col_equilibration;
  double max_original_row_equilibration;
  double sum_original_log_row_equilibration;
  double min_original_row_equilibration;
  double max_original_col_equilibration;
  double sum_original_log_col_equilibration;
  double min_original_col_equilibration;
  double matrix_max_value;
  double matrix_min_value;
  HighsInt iRow_2;
  HighsInt iCol_1;
  double log2;
  double max_row_scale;
  double min_row_scale;
  double max_col_scale;
  double min_col_scale;
  double row_equilibration;
  HighsInt iRow_1;
  double value_2;
  HighsInt iRow;
  HighsInt k_2;
  double col_equilibration;
  double value_1;
  HighsInt k_1;
  double abs_col_cost;
  double col_max_value;
  double col_min_value;
  HighsInt iCol;
  HighsInt search_count;
  vector<double,_std::allocator<double>_> row_max_value;
  vector<double,_std::allocator<double>_> row_min_value;
  double max_allow_row_scale;
  double min_allow_row_scale;
  double max_allow_col_scale;
  double min_allow_col_scale;
  double finite_infinity;
  double min_allow_scale;
  double max_allow_scale;
  bool include_cost_in_scaling;
  HighsInt i;
  double min_nonzero_cost;
  double value;
  HighsInt AnX;
  HighsInt k;
  double original_matrix_max_value;
  double original_matrix_min_value;
  HighsInt simplex_scale_strategy;
  vector<double,_std::allocator<double>_> *colCost;
  vector<double,_std::allocator<double>_> *Avalue;
  vector<int,_std::allocator<int>_> *Aindex;
  vector<int,_std::allocator<int>_> *Astart;
  vector<double,_std::allocator<double>_> *rowScale;
  vector<double,_std::allocator<double>_> *colScale;
  HighsScale *scale;
  HighsInt numRow;
  HighsInt numCol;
  size_type in_stack_fffffffffffffa18;
  value_type vVar7;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  int iVar8;
  value_type_conflict1 *in_stack_fffffffffffffa30;
  size_type in_stack_fffffffffffffa38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa40;
  int local_3bc;
  int local_3b8;
  double local_350;
  pointer local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  int local_2dc;
  double local_2d8;
  double local_2d0;
  value_type local_2c8;
  value_type local_2c0;
  value_type local_2b8;
  int local_2b4;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  int local_28c;
  undefined8 local_288;
  undefined8 local_278;
  vector<double,_std::allocator<double>_> local_270;
  vector<double,_std::allocator<double>_> local_250;
  double local_238;
  double local_230;
  double local_228;
  char *local_220;
  double local_218;
  HighsLogOptions *local_210;
  double local_208;
  double local_200;
  double local_1f8;
  char *local_1f0;
  double local_1e8;
  HighsLogOptions *local_1e0;
  double local_1d8;
  HighsLogOptions *local_1d0;
  int local_1c8;
  int local_1c4;
  double local_1c0;
  double local_1b8;
  char *local_1b0;
  double local_1a8;
  HighsLogOptions *local_1a0;
  undefined8 local_198;
  double local_190;
  int local_184;
  double local_180;
  value_type local_178;
  int local_174;
  double local_170;
  double local_168;
  int local_15c;
  double local_158;
  double local_150;
  double local_148;
  int local_13c;
  int local_138;
  undefined8 local_130;
  vector<double,_std::allocator<double>_> local_128 [2];
  vector<double,_std::allocator<double>_> local_f8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8 [3];
  double local_b0;
  byte local_a1;
  value_type local_a0;
  int local_94;
  double local_90;
  value_type local_88;
  int local_80;
  int local_7c;
  double local_78;
  double local_70;
  int local_64;
  vector<double,_std::allocator<double>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  int *local_30;
  int local_24;
  int local_20;
  long local_10;
  byte local_1;
  
  local_20 = *in_RSI;
  local_24 = in_RSI[1];
  local_30 = in_RSI + 0x82;
  local_38 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x88);
  local_40 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x8e);
  local_48 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x24);
  local_50 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x30);
  local_58 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x36);
  local_60 = (vector<double,_std::allocator<double>_> *)(in_RSI + 2);
  local_70 = INFINITY;
  local_78 = 0.0;
  local_7c = 0;
  local_64 = in_EDX;
  local_10 = in_RDI;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_20);
  local_80 = *pvVar2;
  for (; local_7c < local_80; local_7c = local_7c + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_7c);
    local_88 = ABS(*pvVar3);
    pdVar4 = std::min<double>(&local_70,&local_88);
    local_70 = *pdVar4;
    pdVar4 = std::max<double>(&local_78,&local_88);
    local_78 = *pdVar4;
  }
  local_90 = INFINITY;
  for (local_94 = 0; local_94 < local_20; local_94 = local_94 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_60,(long)local_94);
    if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_60,(long)local_94);
      local_a0 = ABS(*pvVar3);
      pdVar4 = std::min<double>(&local_a0,&local_90);
      local_90 = *pdVar4;
    }
  }
  local_a1 = local_90 < 0.1;
  local_c8[1] = 1e+200;
  local_e0 = pow(2.0,(double)*(int *)(local_10 + 0x21c));
  local_d8 = 1.0 / local_e0;
  local_d0 = local_e0;
  local_c8[0] = local_d8;
  local_c8[2] = local_d8;
  local_b0 = local_e0;
  std::allocator<double>::allocator((allocator<double> *)0x4f9d25);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  std::allocator<double>::~allocator((allocator<double> *)0x4f9d59);
  local_130 = 0x16687e92154ef7ac;
  std::allocator<double>::allocator((allocator<double> *)0x4f9d90);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  std::allocator<double>::~allocator((allocator<double> *)0x4f9dc4);
  for (local_138 = 0; local_138 < 6; local_138 = local_138 + 1) {
    for (local_13c = 0; local_13c < local_20; local_13c = local_13c + 1) {
      local_148 = 1e+200;
      local_150 = 1e-200;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_60,(long)local_13c);
      local_158 = ABS(*pvVar3);
      if (((local_a1 & 1) != 0) && ((local_158 != 0.0 || (NAN(local_158))))) {
        pdVar4 = std::min<double>(&local_148,&local_158);
        local_148 = *pdVar4;
        pdVar4 = std::max<double>(&local_150,&local_158);
        local_150 = *pdVar4;
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_13c);
      for (local_15c = *pvVar2; iVar8 = local_15c,
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (local_48,(long)(local_13c + 1)), iVar8 < *pvVar2;
          local_15c = local_15c + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_15c);
        pvVar5 = local_40;
        dVar6 = *pvVar3;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_15c);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)*pvVar2);
        local_168 = ABS(dVar6) * *pvVar3;
        pdVar4 = std::min<double>(&local_148,&local_168);
        local_148 = *pdVar4;
        pdVar4 = std::max<double>(&local_150,&local_168);
        local_150 = *pdVar4;
      }
      local_170 = sqrt(local_148 * local_150);
      local_170 = 1.0 / local_170;
      pdVar4 = std::max<double>(local_c8,&local_170);
      pdVar4 = std::min<double>(pdVar4,&local_d0);
      dVar6 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_13c);
      *pvVar3 = dVar6;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_13c);
      for (local_174 = *pvVar2; iVar8 = local_174,
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (local_48,(long)(local_13c + 1)), iVar8 < *pvVar2;
          local_174 = local_174 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_174);
        local_178 = *pvVar2;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_174);
        dVar6 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_13c);
        local_180 = ABS(dVar6) * *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_178)
        ;
        pdVar4 = std::min<double>(pvVar3,&local_180);
        dVar6 = *pdVar4;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_178)
        ;
        *pvVar3 = dVar6;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_128,(long)local_178)
        ;
        pdVar4 = std::max<double>(pvVar3,&local_180);
        dVar6 = *pdVar4;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_128,(long)local_178)
        ;
        *pvVar3 = dVar6;
      }
    }
    for (local_184 = 0; local_184 < local_24; local_184 = local_184 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_184);
      dVar6 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_128,(long)local_184);
      local_190 = sqrt(dVar6 * *pvVar3);
      local_190 = 1.0 / local_190;
      pdVar4 = std::max<double>(&local_d8,&local_190);
      pdVar4 = std::min<double>(pdVar4,&local_e0);
      dVar6 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_184);
      *pvVar3 = dVar6;
    }
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(value_type_conflict1 *)0x4fa433)
    ;
    local_198 = 0x16687e92154ef7ac;
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(value_type_conflict1 *)0x4fa464)
    ;
  }
  local_1a0 = (HighsLogOptions *)0x6974e718d7d7625a;
  local_1a8 = 1e-200;
  local_1b0 = (char *)0x6974e718d7d7625a;
  local_1b8 = 1e-200;
  local_1c0 = log(2.0);
  for (local_1c4 = 0; local_1c4 < local_20; local_1c4 = local_1c4 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_1c4);
    dVar6 = log(*pvVar3);
    dVar6 = floor(dVar6 / local_1c0 + 0.5);
    dVar6 = pow(2.0,dVar6);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_1c4);
    *pvVar3 = dVar6;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_1c4);
    pdVar4 = std::min<double>(pvVar3,(double *)&local_1a0);
    local_1a0 = (HighsLogOptions *)*pdVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_1c4);
    pdVar4 = std::max<double>(pvVar3,&local_1a8);
    local_1a8 = *pdVar4;
  }
  for (local_1c8 = 0; local_1c8 < local_24; local_1c8 = local_1c8 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_1c8);
    dVar6 = log(*pvVar3);
    dVar6 = floor(dVar6 / local_1c0 + 0.5);
    dVar6 = pow(2.0,dVar6);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_1c8);
    *pvVar3 = dVar6;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_1c8);
    pdVar4 = std::min<double>(pvVar3,(double *)&local_1b0);
    local_1b0 = (char *)*pdVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_1c8);
    pdVar4 = std::max<double>(pvVar3,&local_1b8);
    local_1b8 = *pdVar4;
  }
  local_1d0 = (HighsLogOptions *)0x6974e718d7d7625a;
  local_1d8 = 0.0;
  local_1e0 = (HighsLogOptions *)0x6974e718d7d7625a;
  local_1e8 = 0.0;
  local_1f0 = (char *)0x0;
  local_1f8 = 1e+200;
  local_200 = 0.0;
  local_208 = 0.0;
  local_210 = (HighsLogOptions *)0x6974e718d7d7625a;
  local_218 = 0.0;
  local_220 = (char *)0x0;
  local_228 = 1e+200;
  local_230 = 0.0;
  local_238 = 0.0;
  std::allocator<double>::allocator((allocator<double> *)0x4fa803);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  std::allocator<double>::~allocator((allocator<double> *)0x4fa837);
  local_278 = 0x16687e92154ef7ac;
  std::allocator<double>::allocator((allocator<double> *)0x4fa86e);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  std::allocator<double>::~allocator((allocator<double> *)0x4fa8a2);
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(value_type_conflict1 *)0x4fa8bf);
  local_288 = 0x16687e92154ef7ac;
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(value_type_conflict1 *)0x4fa8f0);
  for (local_28c = 0; local_28c < local_20; local_28c = local_28c + 1) {
    local_298 = 1e+200;
    local_2a0 = 1e-200;
    local_2a8 = 1e+200;
    local_2b0 = 1e-200;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_28c);
    for (local_2b4 = *pvVar2; iVar8 = local_2b4,
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)(local_28c + 1)),
        iVar8 < *pvVar2; local_2b4 = local_2b4 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_2b4);
      local_2b8 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_2b4);
      local_2c0 = ABS(*pvVar3);
      pdVar4 = std::min<double>(&local_2c0,&local_298);
      local_298 = *pdVar4;
      pdVar4 = std::max<double>(&local_2c0,&local_2a0);
      local_2a0 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_250,(long)local_2b8);
      pdVar4 = std::min<double>(pvVar3,&local_2c0);
      dVar6 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_250,(long)local_2b8);
      *pvVar3 = dVar6;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_270,(long)local_2b8);
      pdVar4 = std::max<double>(pvVar3,&local_2c0);
      dVar6 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_270,(long)local_2b8);
      *pvVar3 = dVar6;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_28c);
      dVar6 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_2b8);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_2b4);
      *pvVar3 = *pvVar3 * dVar6 * dVar1;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_2b4);
      local_2c8 = ABS(*pvVar3);
      pdVar4 = std::min<double>(&local_2c8,&local_2a8);
      local_2a8 = *pdVar4;
      pdVar4 = std::max<double>(&local_2c8,&local_2b0);
      local_2b0 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_2b8);
      pdVar4 = std::min<double>(pvVar3,&local_2c8);
      dVar6 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_2b8);
      *pvVar3 = dVar6;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_128,(long)local_2b8);
      pdVar4 = std::max<double>(pvVar3,&local_2c8);
      dVar6 = *pdVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_128,(long)local_2b8);
      *pvVar3 = dVar6;
    }
    pdVar4 = std::min<double>((double *)&local_1d0,&local_2a8);
    local_1d0 = (HighsLogOptions *)*pdVar4;
    pdVar4 = std::max<double>(&local_1d8,&local_2b0);
    local_1d8 = *pdVar4;
    local_2d0 = sqrt(local_298 * local_2a0);
    local_2d0 = 1.0 / local_2d0;
    pdVar4 = std::min<double>(&local_2d0,(double *)&local_1e0);
    local_1e0 = (HighsLogOptions *)*pdVar4;
    dVar6 = log(local_2d0);
    local_1e8 = local_1e8 + dVar6;
    pdVar4 = std::max<double>(&local_2d0,(double *)&local_1f0);
    local_1f0 = (char *)*pdVar4;
    local_2d8 = sqrt(local_2a8 * local_2b0);
    local_2d8 = 1.0 / local_2d8;
    pdVar4 = std::min<double>(&local_2d8,(double *)&local_210);
    local_210 = (HighsLogOptions *)*pdVar4;
    dVar6 = log(local_2d8);
    local_218 = local_218 + dVar6;
    pdVar4 = std::max<double>(&local_2d8,(double *)&local_220);
    local_220 = (char *)*pdVar4;
  }
  for (local_2dc = 0; local_2dc < local_24; local_2dc = local_2dc + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_250,(long)local_2dc);
    dVar6 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_270,(long)local_2dc);
    local_2e8 = sqrt(dVar6 * *pvVar3);
    local_2e8 = 1.0 / local_2e8;
    pdVar4 = std::min<double>(&local_2e8,&local_1f8);
    local_1f8 = *pdVar4;
    dVar6 = log(local_2e8);
    local_200 = local_200 + dVar6;
    pdVar4 = std::max<double>(&local_2e8,&local_208);
    local_208 = *pdVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_f8,(long)local_2dc);
    dVar6 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_128,(long)local_2dc);
    local_2f0 = sqrt(dVar6 * *pvVar3);
    local_2f0 = 1.0 / local_2f0;
    pdVar4 = std::min<double>(&local_2f0,&local_228);
    local_228 = *pdVar4;
    dVar6 = log(local_2f0);
    local_230 = local_230 + dVar6;
    pdVar4 = std::max<double>(&local_2f0,&local_238);
    local_238 = *pdVar4;
  }
  local_2f8 = exp(local_1e8 / (double)local_20);
  local_300 = exp(local_200 / (double)local_24);
  local_308 = exp(local_218 / (double)local_20);
  local_310 = exp(local_230 / (double)local_24);
  if (*(int *)(local_10 + 0x208) != 0) {
    highsLogDev(local_1e0,SUB84(local_2f8,0),local_1f0,local_1f8,local_300,local_208,
                local_10 + 0x380,1,
                "Scaling: Original equilibration: min/mean/max %11.4g/%11.4g/%11.4g (cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n"
               );
    highsLogDev(local_210,SUB84(local_308,0),local_220,local_228,local_310,local_238,
                local_10 + 0x380,1,
                "Scaling: Final    equilibration: min/mean/max %11.4g/%11.4g/%11.4g (cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n"
               );
  }
  local_320 = 1.0 / local_2f8;
  pdVar4 = std::max<double>(&local_2f8,&local_320);
  local_318 = *pdVar4;
  local_330 = 1.0 / local_300;
  pdVar4 = std::max<double>(&local_300,&local_330);
  local_328 = *pdVar4;
  local_340 = 1.0 / local_308;
  pdVar4 = std::max<double>(&local_308,&local_340);
  local_338 = *pdVar4;
  local_350 = 1.0 / local_310;
  pvVar5 = (vector<double,_std::allocator<double>_> *)std::max<double>(&local_310,&local_350);
  local_348 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
  log_options_ = (HighsLogOptions *)sqrt((local_318 * local_328) / (local_338 * (double)local_348));
  log_options__00 =
       (HighsLogOptions *)
       (((double)local_1f0 / (double)local_1e0 + local_208 / local_1f8) /
       ((double)local_220 / (double)local_210 + local_238 / local_228));
  format = (char *)(local_1d8 / (double)local_1d0);
  dVar6 = local_78 / local_70;
  log_options__01 = (HighsLogOptions *)(dVar6 / (double)format);
  if (*(int *)(local_10 + 0x208) != 0) {
    highsLogDev((HighsLogOptions *)(local_10 + 0x380),kInfo,
                "Scaling: Extreme equilibration improvement =      ( %11.4g + %11.4g) / ( %11.4g + %11.4g)  =      %11.4g / %11.4g  = %11.4g\n"
               );
    highsLogDev((HighsLogOptions *)(local_10 + 0x380),kInfo,
                "Scaling: Mean    equilibration improvement = sqrt(( %11.4g * %11.4g) / ( %11.4g * %11.4g)) = sqrt(%11.4g / %11.4g) = %11.4g\n"
               );
    highsLogDev(local_1d0,SUB84(local_1d8,0),format,local_70,local_78,dVar6,log_options__01,
                local_10 + 0x380,1,
                "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, %0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n"
               );
    highsLogDev(log_options_,(HighsLogType)(local_10 + 0x380),(char *)0x1,
                "Scaling: Improves    mean equilibration by a factor %0.4g\n");
    highsLogDev(log_options__00,(HighsLogType)(local_10 + 0x380),(char *)0x1,
                "Scaling: Improves extreme equilibration by a factor %0.4g\n");
    highsLogDev(log_options__01,(HighsLogType)(local_10 + 0x380),(char *)0x1,
                "Scaling: Improves max/min matrix values by a factor %0.4g\n");
  }
  log_options__02 =
       (HighsLogOptions *)((double)log_options__00 * (double)log_options_ * (double)log_options__01)
  ;
  if ((local_64 == 3) || (1.0 <= (double)log_options__02)) {
    if (*(int *)(local_10 + 0x208) != 0) {
      highsLogDev(local_1a0,SUB84(local_1a8,0),local_1b0,local_1b8,local_10 + 0x380,1,
                  "Scaling: Factors are in [%0.4g, %0.4g] for columns and in [%0.4g, %0.4g] for rows\n"
                 );
      highsLogDev(log_options__02,0,(char *)(local_10 + 0x380),1,
                  "Scaling: Improvement factor is %0.4g >= %0.4g so scale LP\n");
      if ((double)log_options__00 < 1.0) {
        highsLogDev(log_options__00,(HighsLogType)(local_10 + 0x380),(char *)0x4,
                    "Scaling: Applying scaling with extreme improvement of %0.4g\n");
      }
      if ((double)log_options_ < 1.0) {
        highsLogDev(log_options_,(HighsLogType)(local_10 + 0x380),(char *)0x4,
                    "Scaling: Applying scaling with mean improvement of %0.4g\n");
      }
      if ((double)log_options__01 < 1.0) {
        highsLogDev(log_options__01,(HighsLogType)(local_10 + 0x380),(char *)0x4,
                    "Scaling: Applying scaling with matrix value ratio improvement of %0.4g\n");
      }
      if ((double)log_options__02 < 10.0) {
        highsLogDev(log_options__02,0,(char *)(local_10 + 0x380),4,
                    "Scaling: Applying scaling with improvement factor %0.4g < 10*(%0.4g) improvement\n"
                   );
      }
    }
    local_1 = 1;
  }
  else {
    for (local_3b8 = 0; local_3b8 < local_20; local_3b8 = local_3b8 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_48,(long)local_3b8);
      local_3bc = *pvVar2;
      while (iVar8 = local_3bc,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_48,(long)(local_3b8 + 1)), iVar8 < *pvVar2) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_3bc);
        iVar8 = *pvVar2;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_3b8);
        vVar7 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)iVar8);
        dVar6 = vVar7 * *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)local_3bc);
        *pvVar3 = *pvVar3 / dVar6;
        local_3bc = local_3bc + 1;
      }
    }
    if (*(int *)(local_10 + 0x208) != 0) {
      highsLogDev(log_options__02,0,(char *)(local_10 + 0x380),1,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no scaling applied\n");
    }
    local_1 = 0;
  }
  std::vector<double,_std::allocator<double>_>::~vector(pvVar5);
  std::vector<double,_std::allocator<double>_>::~vector(pvVar5);
  std::vector<double,_std::allocator<double>_>::~vector(pvVar5);
  std::vector<double,_std::allocator<double>_>::~vector(pvVar5);
  return (bool)(local_1 & 1);
}

Assistant:

bool equilibrationScaleMatrix(const HighsOptions& options, HighsLp& lp,
                              const HighsInt use_scale_strategy) {
  HighsInt numCol = lp.num_col_;
  HighsInt numRow = lp.num_row_;
  HighsScale& scale = lp.scale_;
  vector<double>& colScale = scale.col;
  vector<double>& rowScale = scale.row;
  vector<HighsInt>& Astart = lp.a_matrix_.start_;
  vector<HighsInt>& Aindex = lp.a_matrix_.index_;
  vector<double>& Avalue = lp.a_matrix_.value_;
  vector<double>& colCost = lp.col_cost_;

  HighsInt simplex_scale_strategy = use_scale_strategy;

  double original_matrix_min_value = kHighsInf;
  double original_matrix_max_value = 0;
  for (HighsInt k = 0, AnX = Astart[numCol]; k < AnX; k++) {
    double value = fabs(Avalue[k]);
    original_matrix_min_value = min(original_matrix_min_value, value);
    original_matrix_max_value = max(original_matrix_max_value, value);
  }

  // Include cost in scaling if minimum nonzero cost is less than 0.1
  double min_nonzero_cost = kHighsInf;
  for (HighsInt i = 0; i < numCol; i++) {
    if (colCost[i]) min_nonzero_cost = min(fabs(colCost[i]), min_nonzero_cost);
  }
  bool include_cost_in_scaling = false;
  include_cost_in_scaling = min_nonzero_cost < 0.1;

  // Limits on scaling factors
  double max_allow_scale;
  double min_allow_scale;
  // Now that kHighsInf =
  // std::numeric_limits<double>::infinity(), this Qi-trick doesn't
  // work so, in recognition, use the old value of kHighsInf
  const double finite_infinity = 1e200;
  max_allow_scale = pow(2.0, options.allowed_matrix_scale_factor);
  min_allow_scale = 1 / max_allow_scale;

  double min_allow_col_scale = min_allow_scale;
  double max_allow_col_scale = max_allow_scale;
  double min_allow_row_scale = min_allow_scale;
  double max_allow_row_scale = max_allow_scale;

  // Search up to 6 times
  vector<double> row_min_value(numRow, finite_infinity);
  vector<double> row_max_value(numRow, 1 / finite_infinity);
  for (HighsInt search_count = 0; search_count < 6; search_count++) {
    // Find column scale, prepare row data
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      // For column scale (find)
      double col_min_value = finite_infinity;
      double col_max_value = 1 / finite_infinity;
      double abs_col_cost = fabs(colCost[iCol]);
      if (include_cost_in_scaling && abs_col_cost != 0) {
        col_min_value = min(col_min_value, abs_col_cost);
        col_max_value = max(col_max_value, abs_col_cost);
      }
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        double value = fabs(Avalue[k]) * rowScale[Aindex[k]];
        col_min_value = min(col_min_value, value);
        col_max_value = max(col_max_value, value);
      }
      double col_equilibration = 1 / sqrt(col_min_value * col_max_value);
      // Ensure that column scale factor is not excessively large or small
      colScale[iCol] =
          min(max(min_allow_col_scale, col_equilibration), max_allow_col_scale);
      // For row scale (only collect)
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        double value = fabs(Avalue[k]) * colScale[iCol];
        row_min_value[iRow] = min(row_min_value[iRow], value);
        row_max_value[iRow] = max(row_max_value[iRow], value);
      }
    }
    // For row scale (find)
    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
      double row_equilibration =
          1 / sqrt(row_min_value[iRow] * row_max_value[iRow]);
      // Ensure that row scale factor is not excessively large or small
      rowScale[iRow] =
          min(max(min_allow_row_scale, row_equilibration), max_allow_row_scale);
    }
    row_min_value.assign(numRow, finite_infinity);
    row_max_value.assign(numRow, 1 / finite_infinity);
  }
  // Make it numerically better
  // Also determine the max and min row and column scaling factors
  double min_col_scale = finite_infinity;
  double max_col_scale = 1 / finite_infinity;
  double min_row_scale = finite_infinity;
  double max_row_scale = 1 / finite_infinity;
  const double log2 = log(2.0);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    colScale[iCol] = pow(2.0, floor(log(colScale[iCol]) / log2 + 0.5));
    min_col_scale = min(colScale[iCol], min_col_scale);
    max_col_scale = max(colScale[iCol], max_col_scale);
  }
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    rowScale[iRow] = pow(2.0, floor(log(rowScale[iRow]) / log2 + 0.5));
    min_row_scale = min(rowScale[iRow], min_row_scale);
    max_row_scale = max(rowScale[iRow], max_row_scale);
  }
  // Apply scaling to matrix and bounds
  double matrix_min_value = finite_infinity;
  double matrix_max_value = 0;
  double min_original_col_equilibration = finite_infinity;
  double sum_original_log_col_equilibration = 0;
  double max_original_col_equilibration = 0;
  double min_original_row_equilibration = finite_infinity;
  double sum_original_log_row_equilibration = 0;
  double max_original_row_equilibration = 0;
  double min_col_equilibration = finite_infinity;
  double sum_log_col_equilibration = 0;
  double max_col_equilibration = 0;
  double min_row_equilibration = finite_infinity;
  double sum_log_row_equilibration = 0;
  double max_row_equilibration = 0;
  vector<double> original_row_min_value(numRow, finite_infinity);
  vector<double> original_row_max_value(numRow, 1 / finite_infinity);
  row_min_value.assign(numRow, finite_infinity);
  row_max_value.assign(numRow, 1 / finite_infinity);
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    double original_col_min_value = finite_infinity;
    double original_col_max_value = 1 / finite_infinity;
    double col_min_value = finite_infinity;
    double col_max_value = 1 / finite_infinity;
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      HighsInt iRow = Aindex[k];
      const double original_value = fabs(Avalue[k]);
      original_col_min_value = min(original_value, original_col_min_value);
      original_col_max_value = max(original_value, original_col_max_value);
      original_row_min_value[iRow] =
          min(original_row_min_value[iRow], original_value);
      original_row_max_value[iRow] =
          max(original_row_max_value[iRow], original_value);
      Avalue[k] *= (colScale[iCol] * rowScale[iRow]);
      const double value = fabs(Avalue[k]);
      col_min_value = min(value, col_min_value);
      col_max_value = max(value, col_max_value);
      row_min_value[iRow] = min(row_min_value[iRow], value);
      row_max_value[iRow] = max(row_max_value[iRow], value);
    }
    matrix_min_value = min(matrix_min_value, col_min_value);
    matrix_max_value = max(matrix_max_value, col_max_value);

    const double original_col_equilibration =
        1 / sqrt(original_col_min_value * original_col_max_value);
    min_original_col_equilibration =
        min(original_col_equilibration, min_original_col_equilibration);
    sum_original_log_col_equilibration += log(original_col_equilibration);
    max_original_col_equilibration =
        max(original_col_equilibration, max_original_col_equilibration);
    const double col_equilibration = 1 / sqrt(col_min_value * col_max_value);
    min_col_equilibration = min(col_equilibration, min_col_equilibration);
    sum_log_col_equilibration += log(col_equilibration);
    max_col_equilibration = max(col_equilibration, max_col_equilibration);
  }

  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    const double original_row_equilibration =
        1 / sqrt(original_row_min_value[iRow] * original_row_max_value[iRow]);
    min_original_row_equilibration =
        min(original_row_equilibration, min_original_row_equilibration);
    sum_original_log_row_equilibration += log(original_row_equilibration);
    max_original_row_equilibration =
        max(original_row_equilibration, max_original_row_equilibration);
    const double row_equilibration =
        1 / sqrt(row_min_value[iRow] * row_max_value[iRow]);
    min_row_equilibration = min(row_equilibration, min_row_equilibration);
    sum_log_row_equilibration += log(row_equilibration);
    max_row_equilibration = max(row_equilibration, max_row_equilibration);
  }
  const double geomean_original_col_equilibration =
      exp(sum_original_log_col_equilibration / numCol);
  const double geomean_original_row_equilibration =
      exp(sum_original_log_row_equilibration / numRow);
  const double geomean_col_equilibration =
      exp(sum_log_col_equilibration / numCol);
  const double geomean_row_equilibration =
      exp(sum_log_row_equilibration / numRow);
  if (options.log_dev_level) {
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Original equilibration: min/mean/max %11.4g/%11.4g/%11.4g "
        "(cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n",
        min_original_col_equilibration, geomean_original_col_equilibration,
        max_original_col_equilibration, min_original_row_equilibration,
        geomean_original_row_equilibration, max_original_row_equilibration);
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Final    equilibration: min/mean/max %11.4g/%11.4g/%11.4g "
        "(cols); min/mean/max %11.4g/%11.4g/%11.4g (rows)\n",
        min_col_equilibration, geomean_col_equilibration, max_col_equilibration,
        min_row_equilibration, geomean_row_equilibration,
        max_row_equilibration);
  }

  // Compute the mean equilibration improvement
  const double geomean_original_col =
      max(geomean_original_col_equilibration,
          1 / geomean_original_col_equilibration);
  const double geomean_original_row =
      max(geomean_original_row_equilibration,
          1 / geomean_original_row_equilibration);
  const double geomean_col =
      max(geomean_col_equilibration, 1 / geomean_col_equilibration);
  const double geomean_row =
      max(geomean_row_equilibration, 1 / geomean_row_equilibration);
  const double mean_equilibration_improvement =
      sqrt((geomean_original_col * geomean_original_row) /
           (geomean_col * geomean_row));
  // Compute the extreme equilibration improvement
  const double original_col_ratio =
      max_original_col_equilibration / min_original_col_equilibration;
  const double original_row_ratio =
      max_original_row_equilibration / min_original_row_equilibration;
  const double col_ratio = max_col_equilibration / min_col_equilibration;
  const double row_ratio = max_row_equilibration / min_row_equilibration;
  const double extreme_equilibration_improvement =
      (original_col_ratio + original_row_ratio) / (col_ratio + row_ratio);
  // Compute the max/min matrix value improvement
  const double matrix_value_ratio = matrix_max_value / matrix_min_value;
  const double original_matrix_value_ratio =
      original_matrix_max_value / original_matrix_min_value;
  const double matrix_value_ratio_improvement =
      original_matrix_value_ratio / matrix_value_ratio;
  if (options.log_dev_level) {
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Extreme equilibration improvement =      ( %11.4g + "
        "%11.4g) / ( %11.4g + %11.4g)  =      %11.4g / %11.4g  = %11.4g\n",
        original_col_ratio, original_row_ratio, col_ratio, row_ratio,
        (original_col_ratio + original_row_ratio), (col_ratio + row_ratio),
        extreme_equilibration_improvement);
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Mean    equilibration improvement = sqrt(( %11.4g * "
        "%11.4g) / ( %11.4g * %11.4g)) = sqrt(%11.4g / %11.4g) = %11.4g\n",
        geomean_original_col, geomean_original_row, geomean_col, geomean_row,
        (geomean_original_col * geomean_original_row),
        (geomean_col * geomean_row), mean_equilibration_improvement);
    highsLogDev(
        options.log_options, HighsLogType::kInfo,
        "Scaling: Yields [min, max, ratio] matrix values of [%0.4g, %0.4g, "
        "%0.4g]; Originally [%0.4g, %0.4g, %0.4g]: Improvement of %0.4g\n",
        matrix_min_value, matrix_max_value, matrix_value_ratio,
        original_matrix_min_value, original_matrix_max_value,
        original_matrix_value_ratio, matrix_value_ratio_improvement);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "Scaling: Improves    mean equilibration by a factor %0.4g\n",
                mean_equilibration_improvement);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "Scaling: Improves extreme equilibration by a factor %0.4g\n",
                extreme_equilibration_improvement);
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "Scaling: Improves max/min matrix values by a factor %0.4g\n",
                matrix_value_ratio_improvement);
  }
  const bool possibly_abandon_scaling =
      simplex_scale_strategy != kSimplexScaleStrategyForcedEquilibration;
  const double improvement_factor = extreme_equilibration_improvement *
                                    mean_equilibration_improvement *
                                    matrix_value_ratio_improvement;

  const double improvement_factor_required = 1.0;
  const bool poor_improvement =
      improvement_factor < improvement_factor_required;

  // Possibly abandon scaling if it's not improved equilibration significantly
  if (possibly_abandon_scaling && poor_improvement) {
    // Unscale the matrix
    for (HighsInt iCol = 0; iCol < numCol; iCol++) {
      for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
        HighsInt iRow = Aindex[k];
        Avalue[k] /= (colScale[iCol] * rowScale[iRow]);
      }
    }
    if (options.log_dev_level)
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor %0.4g < %0.4g required, so no "
                  "scaling applied\n",
                  improvement_factor, improvement_factor_required);
    return false;
  } else {
    if (options.log_dev_level) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Factors are in [%0.4g, %0.4g] for columns and in "
                  "[%0.4g, %0.4g] for rows\n",
                  min_col_scale, max_col_scale, min_row_scale, max_row_scale);
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Scaling: Improvement factor is %0.4g >= %0.4g so scale LP\n",
                  improvement_factor, improvement_factor_required);
      if (extreme_equilibration_improvement < 1.0) {
        highsLogDev(
            options.log_options, HighsLogType::kWarning,
            "Scaling: Applying scaling with extreme improvement of %0.4g\n",
            extreme_equilibration_improvement);
      }
      if (mean_equilibration_improvement < 1.0) {
        highsLogDev(
            options.log_options, HighsLogType::kWarning,
            "Scaling: Applying scaling with mean improvement of %0.4g\n",
            mean_equilibration_improvement);
      }
      if (matrix_value_ratio_improvement < 1.0) {
        highsLogDev(options.log_options, HighsLogType::kWarning,
                    "Scaling: Applying scaling with matrix value ratio "
                    "improvement of %0.4g\n",
                    matrix_value_ratio_improvement);
      }
      if (improvement_factor < 10 * improvement_factor_required) {
        highsLogDev(options.log_options, HighsLogType::kWarning,
                    "Scaling: Applying scaling with improvement factor %0.4g "
                    "< 10*(%0.4g) improvement\n",
                    improvement_factor, improvement_factor_required);
      }
    }
  }
  return true;
}